

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void __thiscall cmDependsFortran::~cmDependsFortran(cmDependsFortran *this)

{
  cmDependsFortran *this_local;
  
  ~cmDependsFortran(this);
  operator_delete(this,0x130);
  return;
}

Assistant:

cmDependsFortran::~cmDependsFortran()
{
  delete this->Internal;
}